

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

int cimg_library::cimg::fread<float>(float *ptr,unsigned_long nmemb,FILE *stream)

{
  size_t sVar1;
  CImgArgumentException *this;
  unsigned_long uVar2;
  char *pcVar3;
  long lVar4;
  size_t __n;
  
  if ((ptr != (float *)0x0) && (stream != (FILE *)0x0)) {
    lVar4 = 0;
    uVar2 = nmemb;
    if (nmemb != 0) {
      do {
        __n = 0xfc0000;
        if (uVar2 * 4 < 0x3f00000) {
          __n = uVar2;
        }
        sVar1 = fread(ptr + lVar4,4,__n,(FILE *)stream);
        lVar4 = lVar4 + sVar1;
        uVar2 = uVar2 - sVar1;
      } while ((__n == sVar1) && (uVar2 != 0));
      if (uVar2 != 0) {
        warn("cimg::fread(): Only %u/%u elements could be read from file.",lVar4,nmemb);
      }
    }
    return (int)lVar4;
  }
  this = (CImgArgumentException *)__cxa_allocate_exception(0x10);
  pcVar3 = "";
  if (1 < nmemb) {
    pcVar3 = "s";
  }
  CImgArgumentException::CImgArgumentException
            (this,"cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p.",
             nmemb,"float",pcVar3,stream,ptr);
  __cxa_throw(this,&CImgArgumentException::typeinfo,CImgException::~CImgException);
}

Assistant:

inline int fread(T *const ptr, const unsigned long nmemb, std::FILE *stream) {
      if (!ptr || !stream)
        throw CImgArgumentException("cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p.",
                                    nmemb,cimg::type<T>::string(),nmemb>1?"s":"",stream,ptr);
      if (!nmemb) return 0;
      const unsigned long wlimitT = 63*1024*1024, wlimit = wlimitT/sizeof(T);
      unsigned long to_read = nmemb, al_read = 0, l_to_read = 0, l_al_read = 0;
      do {
        l_to_read = (to_read*sizeof(T))<wlimitT?to_read:wlimit;
        l_al_read = (unsigned long)std::fread((void*)(ptr + al_read),sizeof(T),l_to_read,stream);
        al_read+=l_al_read;
        to_read-=l_al_read;
      } while (l_to_read==l_al_read && to_read>0);
      if (to_read>0)
        warn("cimg::fread(): Only %u/%u elements could be read from file.",
             al_read,nmemb);
      return (int)al_read;
    }